

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O0

void __thiscall bitfoot::Bitfoot::AddKnightMoves<false>(Bitfoot *this,uint64_t dests)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_30;
  int local_2c;
  int to;
  int from;
  uint64_t dest;
  uint64_t pieces;
  uint64_t dests_local;
  Bitfoot *this_local;
  
  if ((dests != 0) && (this->pc[4] != 0)) {
    dest = this->pc[4];
    pieces = dests;
    dests_local = (uint64_t)this;
    while (dest != 0) {
      iVar2 = PopLowSquare(&dest,&local_2c);
      _to = *(ulong *)(_KNIGHT_ATK + (long)iVar2 * 8) & pieces & (this->pc[0] ^ 0xffffffffffffffff);
      while (iVar2 = local_2c, _to != 0) {
        iVar3 = PopLowSquare((uint64_t *)&to,&local_30);
        bVar1 = Pinned<false>(this,iVar2,iVar3);
        iVar3 = local_2c;
        iVar2 = local_30;
        if (!bVar1) {
          if ((int)(&_board)[local_30] < 4) {
            iVar4 = StaticExchange<false,true>(this,local_2c,local_30);
            AddMove<false,(bitfoot::MoveType)1>(this,4,iVar3,iVar2,iVar4,(&_board)[local_30],0);
          }
          else {
            iVar4 = ValueOf((&_board)[local_30]);
            AddMove<false,(bitfoot::MoveType)1>
                      (this,4,iVar3,iVar2,iVar4 + -10,(&_board)[local_30],0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

inline void AddKnightMoves(const uint64_t dests) {
    if (!dests || !pc[color|Knight]) {
      return;
    }

    uint64_t pieces = pc[color|Knight];
    uint64_t dest;
    int from;
    int to;

    while (pieces) {
      dest = (_KNIGHT_ATK[PopLowSquare(pieces, from)] & dests & ~pc[color]);
      while (dest) {
        if (!Pinned<color>(from, PopLowSquare(dest, to))) {
          if (_board[to] >= Knight) {
            AddMove<color, Normal>((color|Knight), from, to,
                                   (ValueOf(_board[to]) - 10), _board[to], 0);
          }
          else {
            AddMove<color, Normal>((color|Knight), from, to,
                                   StaticExchange<color, true>(from, to),
                                   _board[to], 0);
          }
        }
      }
    }
  }